

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::ForkBranch<kj::_::Void,_false>::get
          (ForkBranch<kj::_::Void,_false> *this,ExceptionOrValue *output)

{
  NullableValue<kj::Exception> *other;
  bool bVar1;
  
  other = (NullableValue<kj::Exception> *)((this->super_ForkBranchBase).hub.ptr)->resultRef;
  bVar1 = true;
  if (other[1].isSet == false) {
    if (output[1].exception.ptr.isSet != true) goto LAB_003428b6;
    bVar1 = false;
  }
  output[1].exception.ptr.isSet = bVar1;
LAB_003428b6:
  NullableValue<kj::Exception>::operator=((NullableValue<kj::Exception> *)output,other);
  ForkBranchBase::releaseHub(&this->super_ForkBranchBase,output);
  return;
}

Assistant:

void get(ExceptionOrValue& output) noexcept override {
    ExceptionOr<T>& hubResult = getHubResultRef().template as<T>();
    KJ_IF_SOME(value, hubResult.value) {
      output.as<T>().value = copyOrAddRef(value);
    } else {
      output.as<T>().value = kj::none;
    }